

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatIndexBuilder.cpp
# Opt level: O1

void __thiscall FlatIndexBuilder::add_trigram(FlatIndexBuilder *this,FileId fid,TriGram val)

{
  iterator __position;
  ulong local_8;
  
  local_8 = (ulong)val << 0x28 | (ulong)fid;
  __position._M_current =
       (this->raw_data).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->raw_data).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&this->raw_data,__position,&local_8);
  }
  else {
    *__position._M_current = local_8;
    (this->raw_data).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void FlatIndexBuilder::add_trigram(FileId fid, TriGram val) {
    raw_data.push_back(fid | (uint64_t{val} << 40ULL));
}